

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void lodepng::convertToXYZ_gamma
               (float *out,float *in,uint w,uint h,LodePNGInfo *info,uint use_icc,LodePNGICC *icc)

{
  ulong uVar1;
  int in_ECX;
  float in_EDX;
  long in_RSI;
  LodePNGICCCurve *in_RDI;
  long in_R8;
  int in_R9D;
  float fVar2;
  float v_1;
  float v;
  float gamma;
  size_t n;
  size_t c;
  size_t i;
  float local_54;
  float local_50;
  ulong local_38;
  ulong local_30;
  
  uVar1 = (ulong)(uint)((int)in_EDX * in_ECX);
  for (local_30 = 0; local_30 < uVar1 << 2; local_30 = local_30 + 1) {
    (&in_RDI->type)[local_30] = *(uint *)(in_RSI + local_30 * 4);
  }
  if (in_R9D == 0) {
    if ((*(int *)(in_R8 + 0xb4) == 0) || (*(int *)(in_R8 + 0xe0) != 0)) {
      for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
        for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
          local_54 = *(float *)(in_RSI + (local_30 * 4 + local_38) * 4);
          if (0.04045 <= local_54) {
            local_54 = lodepng_powf((float)in_RSI,in_EDX);
          }
          else {
            local_54 = local_54 / 12.92;
          }
          (&in_RDI->type)[local_30 * 4 + local_38] = (uint)local_54;
        }
      }
    }
    else if (*(int *)(in_R8 + 0xb8) != 100000) {
      for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
        for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
          local_50 = *(float *)(in_RSI + (local_30 * 4 + local_38) * 4);
          if (0.0 < local_50) {
            local_50 = lodepng_powf((float)in_RSI,in_EDX);
          }
          (&in_RDI->type)[local_30 * 4 + local_38] = (uint)local_50;
        }
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        fVar2 = iccForwardTRC(in_RDI,(float)((ulong)in_RSI >> 0x20));
        (&in_RDI->type)[local_30 * 4 + local_38] = (uint)fVar2;
      }
    }
  }
  return;
}

Assistant:

static void convertToXYZ_gamma(float* out, const float* in, unsigned w, unsigned h,
                               const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc) {
  size_t i, c;
  size_t n = w * h;
  for(i = 0; i < n * 4; i++) {
    out[i] = in[i];
  }
  if(use_icc) {
    for(i = 0; i < n; i++) {
      for(c = 0; c < 3; c++) {
        /* TODO: this is likely very slow */
        out[i * 4 + c] = iccForwardTRC(&icc->trc[c], in[i * 4 + c]);
      }
    }
  } else if(info->gama_defined && !info->srgb_defined) {
    /* nothing to do if gamma is 1 */
    if(info->gama_gamma != 100000) {
      float gamma = 100000.0f / info->gama_gamma;
      for(i = 0; i < n; i++) {
        for(c = 0; c < 3; c++) {
          float v = in[i * 4 + c];
          out[i * 4 + c] = (v <= 0) ? v : lodepng_powf(v, gamma);
        }
      }
    }
  } else {
    for(i = 0; i < n; i++) {
      for(c = 0; c < 3; c++) {
        /* sRGB gamma expand */
        float v = in[i * 4 + c];
        out[i * 4 + c] = (v < 0.04045f) ? (v / 12.92f) : lodepng_powf((v + 0.055f) / 1.055f, 2.4f);
      }
    }
  }
}